

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall
SharedPtrTests_base_SimpleDestructor_Test::TestBody(SharedPtrTests_base_SimpleDestructor_Test *this)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  bool bVar1;
  int *ptr;
  char *pcVar2;
  char *in_R9;
  string local_e0;
  AssertHelper local_c0;
  Message local_b8;
  bool local_a9;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_;
  Message local_90;
  int local_84;
  size_t local_80;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_1;
  Message local_60;
  void *local_58 [3];
  int *local_40;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  SharedPtr<int> testingPtr;
  int *a;
  SharedPtrTests_base_SimpleDestructor_Test *this_local;
  
  ptr = (int *)operator_new(4);
  *ptr = 0x4d2;
  this_00 = &gtest_ar.message_;
  SharedPtr<int>::SharedPtr((SharedPtr<int> *)this_00,ptr);
  SharedPtr<int>::~SharedPtr((SharedPtr<int> *)this_00);
  local_40 = SharedPtr<int>::get((SharedPtr<int> *)this_00);
  local_58[0] = (void *)0x0;
  testing::internal::EqHelper<false>::Compare<int*,decltype(nullptr)>
            ((EqHelper<false> *)local_38,"testingPtr.get()","nullptr",&local_40,local_58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(&local_60);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/NickTikhomirov[P]AYA3_3/tests/test.cpp"
               ,0x1e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  local_80 = SharedPtr<int>::use_count((SharedPtr<int> *)&gtest_ar.message_);
  local_84 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_78,"testingPtr.use_count()","0",&local_80,&local_84);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/NickTikhomirov[P]AYA3_3/tests/test.cpp"
               ,0x1f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  bVar1 = SharedPtr::operator_cast_to_bool((SharedPtr *)&gtest_ar.message_);
  local_a9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_a8,&local_a9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e0,(internal *)local_a8,(AssertionResult *)"!testingPtr","false","true",in_R9)
    ;
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/NickTikhomirov[P]AYA3_3/tests/test.cpp"
               ,0x20,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  SharedPtr<int>::~SharedPtr((SharedPtr<int> *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(SharedPtrTests_base, SimpleDestructor) {
	int* a;
	a = new int;
	*a = 1234;
	SharedPtr<int> testingPtr(a);
	testingPtr.~SharedPtr();
	EXPECT_EQ(testingPtr.get(), nullptr);	
	EXPECT_EQ(testingPtr.use_count(), 0);
	EXPECT_TRUE(!testingPtr);
}